

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

void free_FFSIndexItem(FFSIndexItemStruct *item)

{
  void *in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)((long)in_RDI + 0x1c); local_c = local_c + 1) {
    if (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 0x28 + 0x10) != 0) {
      free(*(void **)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 0x28 + 0x10));
    }
    if (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 0x28 + 0x20) != 0) {
      free_attr_list(*(undefined8 *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 0x28 + 0x20));
    }
  }
  if (*(long *)((long)in_RDI + 0x20) != 0) {
    free(*(void **)((long)in_RDI + 0x20));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
free_FFSIndexItem(FFSIndexItemStruct *item)
{
    int i;
    for (i = 0; i < item->elem_count; i++) {
	if (item->elements[i].format_id) {
	    free(item->elements[i].format_id);
	}
	if (item->elements[i].attrs) {
	    free_attr_list(item->elements[i].attrs);
	}
    }
    if (item->elements) free(item->elements);
    free(item);
}